

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sf-pcap-ng.c
# Opt level: O0

void * get_optvalue_from_block_data(block_cursor *cursor,option_header *opthdr,char *errbuf)

{
  void *optvalue;
  size_t padded_option_len;
  char *errbuf_local;
  option_header *opthdr_local;
  block_cursor *cursor_local;
  
  cursor_local = (block_cursor *)
                 get_from_block_data(cursor,(ulong)opthdr->option_length + 3 & 0xfffffffffffffffc,
                                     errbuf);
  if (cursor_local == (block_cursor *)0x0) {
    cursor_local = (block_cursor *)0x0;
  }
  return cursor_local;
}

Assistant:

static void *
get_optvalue_from_block_data(struct block_cursor *cursor,
    struct option_header *opthdr, char *errbuf)
{
	size_t padded_option_len;
	void *optvalue;

	/* Pad option length to 4-byte boundary */
	padded_option_len = opthdr->option_length;
	padded_option_len = ((padded_option_len + 3)/4)*4;

	optvalue = get_from_block_data(cursor, padded_option_len, errbuf);
	if (optvalue == NULL) {
		/*
		 * Option value is cut short.
		 */
		return (NULL);
	}

	return (optvalue);
}